

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecsBase.hpp
# Opt level: O3

void __thiscall
sciplot::GridSpecsBase::GridSpecsBase(GridSpecsBase *this,void **vtt,string *tics,bool majortics)

{
  void *pvVar1;
  pointer pcVar2;
  string local_50;
  
  pvVar1 = vtt[1];
  *(void **)&this->super_LineSpecsOf<sciplot::GridSpecsBase> = pvVar1;
  *(void **)(&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[2];
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linestyle._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linestyle.field_2;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linestyle._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linestyle.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linetype._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linetype.field_2;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linetype._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linetype.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linewidth._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linewidth.field_2;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linewidth._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linewidth.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linecolor._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linecolor.field_2;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linecolor._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_linecolor.field_2._M_local_buf[0] = '\0';
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_dashtype._M_dataplus._M_p =
       (pointer)&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_dashtype.field_2;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_dashtype._M_string_length = 0;
  (this->super_LineSpecsOf<sciplot::GridSpecsBase>).m_dashtype.field_2._M_local_buf[0] = '\0';
  DepthSpecsOf<sciplot::GridSpecsBase>::DepthSpecsOf
            (&this->super_DepthSpecsOf<sciplot::GridSpecsBase>,vtt + 3);
  pvVar1 = vtt[5];
  *(void **)&this->super_ShowSpecsOf<sciplot::GridSpecsBase> = pvVar1;
  *(void **)(&(this->super_ShowSpecsOf<sciplot::GridSpecsBase>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[6];
  (this->super_ShowSpecsOf<sciplot::GridSpecsBase>).m_show = true;
  pvVar1 = *vtt;
  *(void **)&this->super_LineSpecsOf<sciplot::GridSpecsBase> = pvVar1;
  *(void **)(&(this->super_LineSpecsOf<sciplot::GridSpecsBase>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[7];
  *(void **)&this->super_DepthSpecsOf<sciplot::GridSpecsBase> = vtt[8];
  *(void **)&this->super_ShowSpecsOf<sciplot::GridSpecsBase> = vtt[9];
  (this->m_tics)._M_dataplus._M_p = (pointer)&(this->m_tics).field_2;
  pcVar2 = (tics->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_tics,pcVar2,pcVar2 + tics->_M_string_length);
  this->m_majortics = majortics;
  (this->super_ShowSpecsOf<sciplot::GridSpecsBase>).m_show = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth,0,
             (char *)(this->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth._M_string_length,
             0x18d4e5);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"#d6d7d9","");
  LineSpecsOf<sciplot::GridSpecsBase>::lineColor
            (&this->super_LineSpecsOf<sciplot::GridSpecsBase>,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  LineSpecsOf<sciplot::GridSpecsBase>::lineWidth(&this->super_LineSpecsOf<sciplot::GridSpecsBase>,1)
  ;
  LineSpecsOf<sciplot::GridSpecsBase>::lineType(&this->super_LineSpecsOf<sciplot::GridSpecsBase>,1);
  LineSpecsOf<sciplot::GridSpecsBase>::dashType(&this->super_LineSpecsOf<sciplot::GridSpecsBase>,0);
  return;
}

Assistant:

inline GridSpecsBase::GridSpecsBase(std::string tics, bool majortics)
: m_tics(tics), m_majortics(majortics)
{
    show(true);
    back();
    lineColor(internal::DEFAULT_GRID_LINECOLOR);
    lineWidth(internal::DEFAULT_GRID_LINEWIDTH);
    lineType(internal::DEFAULT_GRID_LINETYPE);
    dashType(internal::DEFAULT_GRID_DASHTYPE);
}